

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

Matrix * __thiscall Matrix::integrate(Matrix *this)

{
  double *pdVar1;
  size_t __n;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  void *__s;
  int iVar7;
  int dim;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  
  iVar3 = this->nMatrixDimension;
  uVar2 = iVar3 - 1;
  __n = (long)(int)uVar2 * 4;
  uVar8 = 0xffffffffffffffff;
  if (0 < iVar3) {
    uVar8 = __n;
  }
  __s = operator_new__(uVar8);
  if (1 < iVar3) {
    memset(__s,0,__n);
  }
  pdVar4 = this->pData;
  piVar5 = this->pSize;
  piVar6 = this->pMult;
  do {
    lVar10 = (long)(iVar3 + -2);
    bVar12 = uVar2 == 0;
    if (iVar3 == 1) {
LAB_00137015:
      lVar10 = 0;
    }
    else {
      do {
        iVar7 = *(int *)((long)__s + lVar10 * 4) + 1;
        *(int *)((long)__s + lVar10 * 4) = iVar7;
        bVar12 = iVar7 == piVar5[lVar10];
        if (!bVar12) break;
        *(undefined4 *)((long)__s + lVar10 * 4) = 0;
        bVar11 = lVar10 != 0;
        lVar10 = lVar10 + -1;
      } while (bVar11);
      if (iVar3 < 2) goto LAB_00137015;
      uVar8 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + piVar6[uVar8] * *(int *)((long)__s + uVar8 * 4);
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
      lVar10 = (long)iVar7;
    }
    lVar9 = (long)piVar5[(int)uVar2];
    if (1 < lVar9) {
      pdVar1 = pdVar4 + lVar10;
      dVar13 = *pdVar1;
      lVar10 = 1;
      do {
        dVar13 = dVar13 + pdVar1[lVar10];
        pdVar1[lVar10] = dVar13;
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
    if (bVar12) {
      operator_delete__(__s);
      return this;
    }
  } while( true );
}

Assistant:

Matrix &Matrix::integrate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// integrate last dimension of this offset
		for (int i=1; i<pSize[n]; ++i)
			pData[offset+i] += pData[offset + i-1];
	}
	
	delete[] indices;
	return *this;
}